

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::to_string<MoveOnly>(lest *this,MoveOnly *item)

{
  lest local_38 [32];
  MoveOnly *local_18;
  MoveOnly *item_local;
  
  local_18 = item;
  item_local = (MoveOnly *)this;
  make_string<MoveOnly>(local_38,item);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}